

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DefParamSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefParamSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax> *args_2,
          Token *args_3)

{
  Token defparam;
  DefParamSyntax *pDVar1;
  DefParamSyntax *in_RCX;
  long in_RDX;
  Info *in_RSI;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_R8;
  Token in_stack_00000000;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  pDVar1 = (DefParamSyntax *)
           allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  defparam.info = in_RSI;
  defparam.kind = (short)in_RDX;
  defparam._2_1_ = (char)((ulong)in_RDX >> 0x10);
  defparam.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  defparam.rawLen = (int)((ulong)in_RDX >> 0x20);
  slang::syntax::DefParamSyntax::DefParamSyntax
            (in_RCX,in_R8,defparam,
             *(SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax> **)(in_RDX + 8),
             in_stack_00000000);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }